

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O2

void __thiscall
SIPrefix_conversions_Test::~SIPrefix_conversions_Test(SIPrefix_conversions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SIPrefix, conversions)
{
    using namespace units;
    EXPECT_EQ(convert(precise::kilo, precise::mega), 1e-3);
    EXPECT_EQ(convert(precise::mega, precise::milli), 1e9);
    EXPECT_EQ(convert(precise::giga, precise::mega), 1e3);
    EXPECT_NEAR(
        convert(precise::micro, precise::nano), 1e3, test::precise_tolerance);

    EXPECT_EQ(convert(precise::mega, precise::kilo), 1e3);
    EXPECT_EQ(convert(precise::milli, precise::giga), 1e-12);
    EXPECT_EQ(convert(precise::mega, precise::giga), 1e-3);
    EXPECT_NEAR(
        convert(precise::nano, precise::micro), 1e-3, test::precise_tolerance);
}